

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall
wasm::WasmBinaryReader::WasmBinaryReader
          (WasmBinaryReader *this,Module *wasm,FeatureSet features,
          vector<char,_std::allocator<char>_> *input,vector<char,_std::allocator<char>_> *sourceMap)

{
  this->wasm = wasm;
  this->allocator = &wasm->allocator;
  this->input = input;
  this->debugInfo = true;
  this->DWARF = false;
  this->skipFunctionBodies = false;
  this->pos = 0;
  this->startIndex = 0xffffffff;
  (this->seenSections)._M_h._M_buckets = &(this->seenSections)._M_h._M_single_bucket;
  (this->seenSections)._M_h._M_bucket_count = 1;
  (this->seenSections)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->seenSections)._M_h._M_element_count = 0;
  (this->seenSections)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->seenSections)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->seenSections)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->builder).wasm = wasm;
  (this->builder).func = (Function *)0x0;
  (this->builder).builder.wasm = wasm;
  *(__index_type *)
   ((long)&(this->builder).debugLoc.
           super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
   + 0x14) = '\0';
  (this->builder).scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->builder).scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->builder).scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->builder).codeSectionOffset = 0;
  (this->builder).binaryPos = (size_t *)0x0;
  (this->builder).lastBinaryPos = 0;
  (this->builder).labelDepths._M_h._M_buckets = &(this->builder).labelDepths._M_h._M_single_bucket;
  (this->builder).labelDepths._M_h._M_bucket_count = 1;
  (this->builder).labelDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->builder).labelDepths._M_h._M_element_count = 0;
  (this->builder).labelDepths._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->builder).labelDepths._M_h._M_rehash_policy._M_next_resize = 0;
  (this->builder).labelDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->builder).blockHint = 0;
  (this->builder).labelHint = 0;
  (this->sourceMapReader).buffer = sourceMap;
  (this->sourceMapReader).pos = 0;
  (this->sourceMapReader).location = 0;
  (this->sourceMapReader).mappings._M_len = 0;
  (this->sourceMapReader).mappings._M_str = (char *)0x0;
  (this->sourceMapReader).file = 0;
  (this->sourceMapReader).line = 1;
  (this->sourceMapReader).col = 0;
  (this->sourceMapReader).symbol = 0;
  (this->sourceMapReader).hasInfo = false;
  (this->sourceMapReader).hasSymbol = false;
  this->numFuncImports = 0;
  this->numFuncBodies = 0;
  (this->functionTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functionTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->functionTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functionNames)._M_h._M_buckets = &(this->functionNames)._M_h._M_single_bucket;
  (this->functionNames)._M_h._M_bucket_count = 1;
  (this->functionNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->functionNames)._M_h._M_element_count = 0;
  (this->functionNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->functionNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->functionNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->localNames)._M_h._M_buckets = &(this->localNames)._M_h._M_single_bucket;
  (this->localNames)._M_h._M_bucket_count = 1;
  (this->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->localNames)._M_h._M_element_count = 0;
  (this->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->typeNames)._M_h._M_buckets = &(this->typeNames)._M_h._M_single_bucket;
  (this->typeNames)._M_h._M_bucket_count = 1;
  (this->typeNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->typeNames)._M_h._M_element_count = 0;
  (this->typeNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->typeNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->typeNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->fieldNames)._M_h._M_buckets = &(this->fieldNames)._M_h._M_single_bucket;
  (this->fieldNames)._M_h._M_bucket_count = 1;
  (this->fieldNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fieldNames)._M_h._M_element_count = 0;
  (this->fieldNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fieldNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fieldNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tableNames)._M_h._M_buckets = &(this->tableNames)._M_h._M_single_bucket;
  (this->tableNames)._M_h._M_bucket_count = 1;
  (this->tableNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tableNames)._M_h._M_element_count = 0;
  (this->tableNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tableNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tableNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->memoryNames)._M_h._M_buckets = &(this->memoryNames)._M_h._M_single_bucket;
  (this->memoryNames)._M_h._M_bucket_count = 1;
  (this->memoryNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memoryNames)._M_h._M_element_count = 0;
  (this->memoryNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->memoryNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->memoryNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->globalNames)._M_h._M_buckets = &(this->globalNames)._M_h._M_single_bucket;
  (this->globalNames)._M_h._M_bucket_count = 1;
  (this->globalNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->globalNames)._M_h._M_element_count = 0;
  (this->globalNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->globalNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->globalNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tagNames)._M_h._M_buckets = &(this->tagNames)._M_h._M_single_bucket;
  (this->tagNames)._M_h._M_bucket_count = 1;
  (this->tagNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tagNames)._M_h._M_element_count = 0;
  (this->tagNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tagNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tagNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dataNames)._M_h._M_buckets = &(this->dataNames)._M_h._M_single_bucket;
  (this->dataNames)._M_h._M_bucket_count = 1;
  (this->dataNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dataNames)._M_h._M_element_count = 0;
  (this->dataNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dataNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dataNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->elemNames)._M_h._M_buckets = &(this->elemNames)._M_h._M_single_bucket;
  (this->elemNames)._M_h._M_bucket_count = 1;
  (this->elemNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->elemNames)._M_h._M_element_count = 0;
  (this->elemNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->currFunction = (Function *)0x0;
  (this->elemNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->elemNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->endOfFunction = 0xffffffff;
  this->hasDataCount = false;
  (this->strings).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->dataCount = 0;
  (this->strings).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->strings).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (wasm->features).features = features.features;
  return;
}

Assistant:

WasmBinaryReader::WasmBinaryReader(Module& wasm,
                                   FeatureSet features,
                                   const std::vector<char>& input,
                                   std::vector<char>& sourceMap)
  : wasm(wasm), allocator(wasm.allocator), input(input), builder(wasm),
    sourceMapReader(sourceMap) {
  wasm.features = features;
}